

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modulator.cpp
# Opt level: O0

void anon_unknown.dwarf_14a0f7::Modulator_setParamf(EffectProps *props,ALenum param,float val)

{
  effect_exception *peVar1;
  uint in_ESI;
  float *in_RDI;
  float in_XMM0_Da;
  
  if (in_ESI == 1) {
    if ((in_XMM0_Da < 0.0) || (8000.0 < in_XMM0_Da)) {
      peVar1 = (effect_exception *)__cxa_allocate_exception(0x30);
      effect_exception::effect_exception(peVar1,0xa003,"Modulator frequency out of range");
      __cxa_throw(peVar1,&effect_exception::typeinfo,effect_exception::~effect_exception);
    }
    *in_RDI = in_XMM0_Da;
  }
  else {
    if (in_ESI != 2) {
      peVar1 = (effect_exception *)__cxa_allocate_exception(0x30);
      effect_exception::effect_exception
                (peVar1,0xa002,"Invalid modulator float property 0x%04x",(ulong)in_ESI);
      __cxa_throw(peVar1,&effect_exception::typeinfo,effect_exception::~effect_exception);
    }
    if ((in_XMM0_Da < 0.0) || (24000.0 < in_XMM0_Da)) {
      peVar1 = (effect_exception *)__cxa_allocate_exception(0x30);
      effect_exception::effect_exception(peVar1,0xa003,"Modulator high-pass cutoff out of range");
      __cxa_throw(peVar1,&effect_exception::typeinfo,effect_exception::~effect_exception);
    }
    in_RDI[1] = in_XMM0_Da;
  }
  return;
}

Assistant:

void Modulator_setParamf(EffectProps *props, ALenum param, float val)
{
    switch(param)
    {
    case AL_RING_MODULATOR_FREQUENCY:
        if(!(val >= AL_RING_MODULATOR_MIN_FREQUENCY && val <= AL_RING_MODULATOR_MAX_FREQUENCY))
            throw effect_exception{AL_INVALID_VALUE, "Modulator frequency out of range"};
        props->Modulator.Frequency = val;
        break;

    case AL_RING_MODULATOR_HIGHPASS_CUTOFF:
        if(!(val >= AL_RING_MODULATOR_MIN_HIGHPASS_CUTOFF && val <= AL_RING_MODULATOR_MAX_HIGHPASS_CUTOFF))
            throw effect_exception{AL_INVALID_VALUE, "Modulator high-pass cutoff out of range"};
        props->Modulator.HighPassCutoff = val;
        break;

    default:
        throw effect_exception{AL_INVALID_ENUM, "Invalid modulator float property 0x%04x", param};
    }
}